

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileInitGlobal
          (MultiFileFunction<duckdb::ParquetMultiFileInfo> *this,ClientContext *context,
          TableFunctionInitInput *input)

{
  pointer pMVar1;
  pointer pMVar2;
  _Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false> _Var3;
  pointer psVar4;
  TableFilterSet *pTVar5;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var6;
  pointer puVar7;
  optional_ptr<duckdb::TableFilterSet,_true> table_filters;
  pointer pCVar8;
  pointer pLVar9;
  _Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false> _Var10;
  _Alloc_hider _Var11;
  undefined8 bind_data_p;
  bool bVar12;
  __type _Var13;
  int32_t val;
  ReaderInitializeType RVar14;
  int iVar15;
  MultiFileBindData *data;
  type args;
  pointer pMVar16;
  pointer pMVar17;
  undefined4 extraout_var;
  TaskScheduler *this_00;
  unsigned_long uVar18;
  pointer pMVar19;
  BaseUnionData *pBVar20;
  BaseFileReader *pBVar21;
  type reader_data;
  MultiFileList *pMVar22;
  idx_t iVar23;
  pointer pMVar24;
  const_reference __x;
  iterator iVar25;
  reference pvVar26;
  InternalException *pIVar27;
  iterator __begin4;
  pointer args_00;
  pointer puVar28;
  pointer __x_00;
  ulong __n;
  MultiFileBindData *global_state;
  vector<duckdb::MultiFileColumnDefinition,_true> *pvVar29;
  ulong uVar30;
  pointer pCVar31;
  _Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false> local_f0;
  MultiFileList *local_e8;
  allocator local_d9;
  OpenFileInfo file_name;
  optional_idx max_threads;
  undefined1 local_88 [32];
  idx_t column_id;
  vector<duckdb::LogicalType,_true> table_types;
  optional_idx local_38;
  
  local_88._8_8_ = this;
  data = (MultiFileBindData *)
         optional_ptr<const_duckdb::FunctionData,_true>::operator->(&input->bind_data);
  local_f0._M_head_impl = (MultiFileGlobalState *)0x0;
  MultiFileFilterPushdown
            ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)local_88,context,data,
             &input->column_ids,(input->filters).ptr);
  if ((_Head_base<0UL,_duckdb::MultiFileList_*,_false>)local_88._0_8_ ==
      (_Head_base<0UL,_duckdb::MultiFileList_*,_false>)0x0) {
    args = shared_ptr<duckdb::MultiFileList,_true>::operator*(&data->file_list);
    make_uniq<duckdb::MultiFileGlobalState,duckdb::MultiFileList&>((duckdb *)&file_name,args);
  }
  else {
    make_uniq<duckdb::MultiFileGlobalState,duckdb::unique_ptr<duckdb::MultiFileList,std::default_delete<duckdb::MultiFileList>,true>>
              ((duckdb *)&file_name,
               (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
                *)local_88);
  }
  _Var11._M_p = file_name.path._M_dataplus._M_p;
  _Var10._M_head_impl = local_f0._M_head_impl;
  file_name.path._M_dataplus._M_p = (pointer)0x0;
  local_f0._M_head_impl = (MultiFileGlobalState *)_Var11._M_p;
  if (_Var10._M_head_impl != (MultiFileGlobalState *)0x0) {
    (*((_Var10._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])();
    if (file_name.path._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_name.path._M_dataplus._M_p + 8))();
    }
  }
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  pMVar22 = pMVar16->file_list;
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  MultiFileList::InitializeScan(pMVar22,&pMVar16->file_list_scan);
  pMVar1 = (data->reader_bind).schema.
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (data->reader_bind).schema.
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = pMVar22;
  pMVar17 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
            ::operator->(&data->multi_file_reader);
  pvVar29 = &(data->reader_bind).schema;
  if (pMVar1 == pMVar2) {
    pvVar29 = &data->columns;
  }
  local_88._24_8_ = &input->column_indexes;
  (*pMVar17->_vptr_MultiFileReader[9])
            (&file_name,pMVar17,context,&data->file_options,&data->reader_bind,local_e8,pvVar29,
             local_88._24_8_);
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  _Var11 = file_name.path._M_dataplus;
  pMVar22 = local_e8;
  file_name.path._M_dataplus._M_p = (pointer)0x0;
  _Var3._M_head_impl =
       (pMVar16->multi_file_reader_state).
       super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl;
  (pMVar16->multi_file_reader_state).
  super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl =
       (MultiFileReaderGlobalState *)_Var11._M_p;
  if (_Var3._M_head_impl != (MultiFileReaderGlobalState *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_MultiFileReaderGlobalState + 8))();
    if (file_name.path._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_name.path._M_dataplus._M_p + 8))();
    }
  }
  bVar12 = MultiFileList::IsEmpty(pMVar22);
  if (bVar12) {
    file_name.path._M_dataplus._M_p = (pointer)0x0;
    file_name.path._M_string_length = 0;
    file_name.path.field_2._M_allocated_capacity = 0;
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_f0);
  }
  else {
    args_00 = (data->union_readers).
              super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (data->union_readers).
             super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (args_00 == psVar4) {
      if ((data->initial_reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        pBVar21 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&data->initial_reader);
        MultiFileList::GetFirstFile(&file_name,local_e8);
        _Var13 = ::std::operator==(&(pBVar21->file).path,&file_name.path);
        OpenFileInfo::~OpenFileInfo(&file_name);
        if (_Var13) {
          pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                  *)&local_f0);
          make_uniq<duckdb::MultiFileReaderData,duckdb::shared_ptr<duckdb::BaseFileReader,true>>
                    ((duckdb *)&file_name,&data->initial_reader);
          ::std::
          vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
                      *)&pMVar16->readers,
                     (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                      *)&file_name);
          ::std::
          unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
          ::~unique_ptr((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
                         *)&file_name);
        }
      }
      goto LAB_01eace47;
    }
    for (; args_00 != psVar4; args_00 = args_00 + 1) {
      pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                              *)&local_f0);
      make_uniq<duckdb::MultiFileReaderData,duckdb::shared_ptr<duckdb::BaseUnionData,true>&>
                ((duckdb *)&file_name,args_00);
      ::std::
      vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>
                ((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
                  *)&pMVar16->readers,
                 (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  *)&file_name);
      ::std::
      unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>::
      ~unique_ptr((unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
                   *)&file_name);
    }
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_f0);
    puVar28 = (pMVar16->readers).
              super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pMVar16->readers).
             super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar15 = (*local_e8->_vptr_MultiFileList[6])();
    if ((long)puVar7 - (long)puVar28 >> 3 == CONCAT44(extraout_var,iVar15)) goto LAB_01eace47;
    file_name.path._M_dataplus._M_p = (pointer)0x0;
    file_name.path._M_string_length = 0;
    file_name.path.field_2._M_allocated_capacity = 0;
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_f0);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ::_M_move_assign(&(pMVar16->readers).
                    super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                   ,&file_name);
  ::std::
  vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             *)&file_name);
LAB_01eace47:
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  LOCK();
  (pMVar16->file_index).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  global_state = (MultiFileBindData *)local_88._24_8_;
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::operator=
            (&(pMVar16->column_indexes).
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,
             (vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)local_88._24_8_);
  pTVar5 = (input->filters).ptr;
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  (pMVar16->filters).ptr = pTVar5;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator*((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
               *)&local_f0);
  make_uniq<duckdb::ParquetReadGlobalState>();
  _Var11 = file_name.path._M_dataplus;
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  _Var6._M_head_impl =
       (pMVar16->global_state).
       super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
  (pMVar16->global_state).
  super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (GlobalTableFunctionState *)_Var11._M_p;
  if (_Var6._M_head_impl != (GlobalTableFunctionState *)0x0) {
    (*(_Var6._M_head_impl)->_vptr_GlobalTableFunctionState[1])();
  }
  this_00 = TaskScheduler::GetScheduler(context);
  val = TaskScheduler::NumberOfThreads(this_00);
  uVar18 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  pMVar16->max_threads = uVar18;
  local_88._16_8_ = data;
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_f0);
  puVar28 = (pMVar16->readers).
            super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (pMVar16->readers).
           super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bind_data_p = local_88._16_8_;
    if (puVar28 == puVar7) {
      pMVar22 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                          ((shared_ptr<duckdb::MultiFileList,_true> *)(local_88._16_8_ + 0x28));
      iVar15 = (*pMVar22->_vptr_MultiFileList[5])(pMVar22);
      unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
      ::operator*((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                   *)&local_f0);
      max_threads = ParquetMultiFileInfo::MaxThreads
                              ((MultiFileBindData *)bind_data_p,(MultiFileGlobalState *)global_state
                               ,(FileExpandResult)iVar15);
      if (max_threads.index != 0xffffffffffffffff) {
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_f0);
        uVar30 = pMVar16->max_threads;
        iVar23 = optional_idx::GetIndex(&max_threads);
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_f0);
        if (uVar30 < iVar23) {
          iVar23 = uVar30;
        }
        pMVar16->max_threads = iVar23;
      }
      pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                              *)&local_f0);
      if ((pMVar16->multi_file_reader_state).
          super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
          .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl ==
          (MultiFileReaderGlobalState *)0x0) {
        uVar30 = 0;
      }
      else {
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_f0);
        pMVar24 = unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
                  ::operator->(&pMVar16->multi_file_reader_state);
        uVar30 = CONCAT71((int7)((ulong)&local_f0 >> 8),
                          (pMVar24->extra_columns).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pMVar24->extra_columns).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      bVar12 = TableFunctionInitInput::CanRemoveFilterColumns(input);
      if ((byte)(bVar12 | (byte)uVar30) == 1) {
        if ((input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                  *)&local_f0);
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&(pMVar16->projection_ids).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     (long)(input->column_indexes).
                           super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(input->column_indexes).
                           super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
          for (__n = 0; __n < (ulong)((long)(input->column_indexes).
                                            super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                            .
                                            super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(input->column_indexes).
                                            super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                            .
                                            super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5);
              __n = __n + 1) {
            pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                      ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                    *)&local_f0);
            pvVar26 = vector<unsigned_long,_true>::get<true>(&pMVar16->projection_ids,__n);
            *pvVar26 = __n;
          }
        }
        else {
          pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                  *)&local_f0);
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (&(pMVar16->projection_ids).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     &(input->projection_ids).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
        }
        local_e8 = (MultiFileList *)CONCAT44(local_e8._4_4_,(int)uVar30);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&table_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (bind_data_p + 0x130));
        pCVar8 = (input->column_indexes).
                 super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pCVar31 = (input->column_indexes).
                       super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                       super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar31 != pCVar8;
            pCVar31 = pCVar31 + 1) {
          column_id = pCVar31->index;
          if (column_id < 0x8000000000000000) {
            pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                      ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                    *)&local_f0);
            __x = vector<duckdb::LogicalType,_true>::get<true>(&table_types,column_id);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                      (&(pMVar16->scanned_types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x)
            ;
          }
          else {
            iVar25 = ::std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)(bind_data_p + 0x160),&column_id);
            if (iVar25.
                super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                ._M_cur == (__node_type *)0x0) {
              pIVar27 = (InternalException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&file_name,
                         "MultiFileReader - virtual column definition not found",&local_d9);
              InternalException::InternalException(pIVar27,(string *)&file_name);
              __cxa_throw(pIVar27,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                      ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                    *)&local_f0);
            ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
            emplace_back<duckdb::LogicalType&>
                      ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                       &pMVar16->scanned_types,
                       (LogicalType *)
                       ((long)iVar25.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                              ._M_cur + 0x30));
          }
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&table_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        uVar30 = (ulong)local_e8 & 0xffffffff;
      }
      if ((char)uVar30 != '\0') {
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_f0);
        pMVar24 = unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
                  ::operator->(&pMVar16->multi_file_reader_state);
        pLVar9 = (pMVar24->extra_columns).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (__x_00 = (pMVar24->extra_columns).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start; __x_00 != pLVar9;
            __x_00 = __x_00 + 1) {
          pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                  *)&local_f0);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&(pMVar16->scanned_types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x_00
                    );
        }
      }
      _Var10._M_head_impl = local_f0._M_head_impl;
      local_f0._M_head_impl = (MultiFileGlobalState *)0x0;
      *(_func_int ***)local_88._8_8_ = (_func_int **)_Var10._M_head_impl;
      if ((_Head_base<0UL,_duckdb::MultiFileList_*,_false>)local_88._0_8_ !=
          (_Head_base<0UL,_duckdb::MultiFileList_*,_false>)0x0) {
        (*(*(_func_int ***)local_88._0_8_)[1])();
        if (local_f0._M_head_impl != (MultiFileGlobalState *)0x0) {
          (*((local_f0._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState
            [1])();
        }
      }
      return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
              )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
                )local_88._8_8_;
    }
    file_name.path._M_dataplus._M_p = (pointer)&file_name.path.field_2;
    file_name.path._M_string_length = 0;
    file_name.path.field_2._M_allocated_capacity =
         file_name.path.field_2._M_allocated_capacity & 0xffffffffffffff00;
    file_name.extended_info.internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    file_name.extended_info.internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_f0);
    iVar23 = (pMVar16->file_list_scan).current_file_idx;
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_f0);
    MultiFileList::Scan(local_e8,&pMVar16->file_list_scan,&file_name);
    pMVar19 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
              ::operator->(puVar28);
    if ((pMVar19->union_data).internal.
        super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pMVar19 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                ::operator->(puVar28);
      pBVar21 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&pMVar19->reader);
      bVar12 = ::std::operator!=(&file_name.path,&(pBVar21->file).path);
      if (bVar12) {
        pIVar27 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&table_types,
                   "Mismatch in filename order and reader order in multi file scan",
                   (allocator *)&max_threads);
        InternalException::InternalException(pIVar27,(string *)&table_types);
        __cxa_throw(pIVar27,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      reader_data = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    ::operator*(puVar28);
      table_filters.ptr = (input->filters).ptr;
      optional_idx::optional_idx(&local_38,iVar23);
      pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                              *)&local_f0);
      global_state = (MultiFileBindData *)local_88._16_8_;
      RVar14 = InitializeReader(reader_data,(MultiFileBindData *)local_88._16_8_,
                                (vector<duckdb::ColumnIndex,_true> *)local_88._24_8_,table_filters,
                                context,local_38,
                                (optional_ptr<duckdb::MultiFileReaderGlobalState,_true>)
                                (pMVar16->multi_file_reader_state).
                                super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>.
                                _M_head_impl);
      if (RVar14 == SKIP_READING_FILE) {
        pMVar19 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  ::operator->(puVar28);
        pMVar19->file_state = SKIPPED;
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_f0);
        LOCK();
        (pMVar16->file_index).super___atomic_base<unsigned_long>._M_i =
             (pMVar16->file_index).super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      pMVar19 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                ::operator->(puVar28);
      pBVar20 = shared_ptr<duckdb::BaseUnionData,_true>::operator->(&pMVar19->union_data);
      global_state = (MultiFileBindData *)&pBVar20->file;
      bVar12 = ::std::operator!=(&file_name.path,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)global_state);
      if (bVar12) {
        pIVar27 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&table_types,
                   "Mismatch in filename order and union reader order in multi file scan",
                   (allocator *)&max_threads);
        InternalException::InternalException(pIVar27,(string *)&table_types);
        __cxa_throw(pIVar27,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    OpenFileInfo::~OpenFileInfo(&file_name);
    puVar28 = puVar28 + 1;
  } while( true );
}

Assistant:

static unique_ptr<GlobalTableFunctionState> MultiFileInitGlobal(ClientContext &context,
	                                                                TableFunctionInitInput &input) {
		auto &bind_data = input.bind_data->CastNoConst<MultiFileBindData>();
		unique_ptr<MultiFileGlobalState> result;

		// before instantiating a scan trigger a dynamic filter pushdown if possible
		auto new_list = MultiFileFilterPushdown(context, bind_data, input.column_ids, input.filters);
		if (new_list) {
			result = make_uniq<MultiFileGlobalState>(std::move(new_list));
		} else {
			result = make_uniq<MultiFileGlobalState>(*bind_data.file_list);
		}
		auto &file_list = result->file_list;
		file_list.InitializeScan(result->file_list_scan);

		auto &global_columns = bind_data.reader_bind.schema.empty() ? bind_data.columns : bind_data.reader_bind.schema;
		result->multi_file_reader_state = bind_data.multi_file_reader->InitializeGlobalState(
		    context, bind_data.file_options, bind_data.reader_bind, file_list, global_columns, input.column_indexes);

		if (file_list.IsEmpty()) {
			result->readers = {};
		} else if (!bind_data.union_readers.empty()) {
			for (auto &reader : bind_data.union_readers) {
				result->readers.push_back(make_uniq<MultiFileReaderData>(reader));
			}
			if (result->readers.size() != file_list.GetTotalFileCount()) {
				result->readers = {};
			}
		} else if (bind_data.initial_reader) {
			// we can only use the initial reader if it was constructed from the first file
			if (bind_data.initial_reader->GetFileName() == file_list.GetFirstFile().path) {
				result->readers.push_back(make_uniq<MultiFileReaderData>(std::move(bind_data.initial_reader)));
			}
		}

		result->file_index = 0;
		result->column_indexes = input.column_indexes;
		result->filters = input.filters.get();
		result->global_state = OP::InitializeGlobalState(context, bind_data, *result);
		result->max_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads());

		// Ensure all readers are initialized and FileListScan is sync with readers list
		for (auto &reader_data : result->readers) {
			OpenFileInfo file_name;
			idx_t file_idx = result->file_list_scan.current_file_idx;
			file_list.Scan(result->file_list_scan, file_name);
			if (reader_data->union_data) {
				if (file_name.path != reader_data->union_data->GetFileName()) {
					throw InternalException("Mismatch in filename order and union reader order in multi file scan");
				}
			} else {
				D_ASSERT(reader_data->reader);
				if (file_name.path != reader_data->reader->GetFileName()) {
					throw InternalException("Mismatch in filename order and reader order in multi file scan");
				}
				auto init_result = InitializeReader(*reader_data, bind_data, input.column_indexes, input.filters,
				                                    context, file_idx, result->multi_file_reader_state);
				if (init_result == ReaderInitializeType::SKIP_READING_FILE) {
					//! File can be skipped entirely, close it and move on
					reader_data->file_state = MultiFileFileState::SKIPPED;
					result->file_index++;
				}
			}
		}

		auto expand_result = bind_data.file_list->GetExpandResult();
		auto max_threads = OP::MaxThreads(bind_data, *result, expand_result);
		if (max_threads.IsValid()) {
			result->max_threads = MinValue<idx_t>(result->max_threads, max_threads.GetIndex());
		}
		bool require_extra_columns =
		    result->multi_file_reader_state && result->multi_file_reader_state->RequiresExtraColumns();
		if (input.CanRemoveFilterColumns() || require_extra_columns) {
			if (!input.projection_ids.empty()) {
				result->projection_ids = input.projection_ids;
			} else {
				result->projection_ids.resize(input.column_indexes.size());
				for (idx_t i = 0; i < input.column_indexes.size(); i++) {
					result->projection_ids[i] = i;
				}
			}

			const auto table_types = bind_data.types;
			for (const auto &col_idx : input.column_indexes) {
				auto column_id = col_idx.GetPrimaryIndex();
				if (col_idx.IsVirtualColumn()) {
					auto entry = bind_data.virtual_columns.find(column_id);
					if (entry == bind_data.virtual_columns.end()) {
						throw InternalException("MultiFileReader - virtual column definition not found");
					}
					result->scanned_types.emplace_back(entry->second.type);
				} else {
					result->scanned_types.push_back(table_types[column_id]);
				}
			}
		}
		if (require_extra_columns) {
			for (const auto &column_type : result->multi_file_reader_state->extra_columns) {
				result->scanned_types.push_back(column_type);
			}
		}
		return std::move(result);
	}